

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchableObjectHolder.hpp
# Opt level: O1

bool __thiscall
gmlc::concurrency::SearchableObjectHolder<helics::Core,_helics::CoreType>::copyObject
          (SearchableObjectHolder<helics::Core,_helics::CoreType> *this,string *copyFromName,
          string *copyToName)

{
  int iVar1;
  iterator iVar2;
  iterator iVar3;
  byte bVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Core>_>_>,_bool>
  pVar5;
  shared_ptr<helics::Core> newObjectPtr;
  shared_ptr<helics::Core> local_38;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Core>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Core>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Core>_>_>_>
            ::find(&(this->objectMap)._M_t,copyFromName);
    if ((_Rb_tree_header *)iVar2._M_node == &(this->objectMap)._M_t._M_impl.super__Rb_tree_header) {
      bVar4 = 0;
    }
    else {
      local_38.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)(iVar2._M_node + 2);
      local_38.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)iVar2._M_node[2]._M_parent;
      if ((_Base_ptr)
          local_38.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&((_Base_ptr)
                   local_38.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi)->_M_parent =
               *(int *)&((_Base_ptr)
                        local_38.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&((_Base_ptr)
                   local_38.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi)->_M_parent =
               *(int *)&((_Base_ptr)
                        local_38.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_parent + 1;
        }
      }
      pVar5 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<helics::Core>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<helics::Core>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<helics::Core>>>>
              ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<helics::Core>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<helics::Core>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<helics::Core>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<helics::Core>>>>
                          *)&this->objectMap,copyToName,&local_38);
      bVar4 = pVar5.second;
      if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        iVar3 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>_>_>_>
                ::find(&(this->typeMap)._M_t,iVar2._M_node + 1);
        if ((_Rb_tree_header *)iVar3._M_node != &(this->typeMap)._M_t._M_impl.super__Rb_tree_header)
        {
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<helics::CoreType,std::allocator<helics::CoreType>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<helics::CoreType,std::allocator<helics::CoreType>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<helics::CoreType,std::allocator<helics::CoreType>>>>>
          ::
          _M_emplace_unique<std::__cxx11::string_const&,std::vector<helics::CoreType,std::allocator<helics::CoreType>>&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<helics::CoreType,std::allocator<helics::CoreType>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<helics::CoreType,std::allocator<helics::CoreType>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<helics::CoreType,std::allocator<helics::CoreType>>>>>
                      *)&this->typeMap,copyToName,
                     (vector<helics::CoreType,_std::allocator<helics::CoreType>_> *)
                     (iVar3._M_node + 2));
        }
      }
      if ((_Base_ptr)
          local_38.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Base_ptr)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_38.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return (bool)(bVar4 & 1);
  }
  std::__throw_system_error(iVar1);
}

Assistant:

bool copyObject(const std::string& copyFromName,
                    const std::string& copyToName)
    {
        std::lock_guard<std::mutex> lock(mapLock);
        auto fnd = objectMap.find(copyFromName);
        if (fnd != objectMap.end()) {
            auto newObjectPtr = fnd->second;
            auto ret = objectMap.emplace(copyToName, std::move(newObjectPtr));
            if (ret.second) {
                auto fnd2 = typeMap.find(fnd->first);
                if (fnd2 != typeMap.end()) {
                    typeMap.emplace(copyToName, fnd2->second);
                }
            }

            return ret.second;
        }
        return false;
    }